

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_io_flush(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  ptrdiff_t pVar3;
  TRef tr;
  TRef fp;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  RecordFFData *local_10;
  
  _fp = rd;
  rd_local = (RecordFFData *)J;
  TVar1 = recff_io_fp(J,&tr,rd->data);
  TVar1 = lj_ir_call((jit_State *)rd_local,IRCALL_fflush,(ulong)TVar1);
  pVar3 = results_wanted((jit_State *)rd_local);
  local_10 = rd_local;
  if (pVar3 != 0) {
    TVar2 = lj_ir_kint((jit_State *)rd_local,0);
    J_local._6_2_ = 0x893;
    J_local._2_2_ = (undefined2)TVar2;
    *(undefined2 *)&local_10[7].field_0x14 = 0x893;
    *(short *)&local_10[7].data = (short)TVar1;
    *(undefined2 *)((long)&local_10[7].data + 2) = J_local._2_2_;
    J_local._4_2_ = (short)TVar1;
    lj_opt_fold((jit_State *)rd_local);
  }
  **(undefined4 **)&rd_local[6].data = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_flush(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef tr = lj_ir_call(J, IRCALL_fflush, fp);
  if (results_wanted(J) != 0)  /* Check result only if not ignored. */
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, 0));
  J->base[0] = TREF_TRUE;
}